

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void CombinationKeygenRecurse<unsigned_long,unsigned_long>
               (unsigned_long *key,int len,int maxlen,unsigned_long *blocks,int blockcount,
               pfHash hash,vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  ulong uVar1;
  unsigned_long h;
  value_type_conflict3 local_38;
  
  if (len != maxlen) {
    for (uVar1 = 0; (uint)(~(blockcount >> 0x1f) & blockcount) != uVar1; uVar1 = uVar1 + 1) {
      key[len] = blocks[uVar1];
      (*hash)(key,len * 8 + 8,0,&local_38);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(hashes,&local_38);
      CombinationKeygenRecurse<unsigned_long,unsigned_long>
                (key,len + 1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}